

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBar::ComputeKRMmatricesGlobal
          (ChElementBar *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer psVar8;
  element_type *peVar9;
  element_type *peVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Scalar *pSVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_1f8;
  double commonfactor;
  ChMatrix33<double> local_1e8;
  ChMatrix33<double> kgV;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_148;
  ChMatrix33<double> V;
  ChMatrix33<double> *local_c0;
  ChMatrix33<double> *local_b8;
  ChVectorN<double,_3> dircolumn;
  ChVector<double> dir;
  ChMatrix33<double> keV;
  
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 6) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 6)) {
    psVar8 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar9 = (psVar8->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar8[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    V.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])((long)&peVar10->super_ChNodeFEAbase + 0x20),
                    *(undefined1 (*) [16])((long)&peVar9->super_ChNodeFEAbase + 0x20));
    V.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         *(double *)&peVar10->field_0x30 - *(double *)&peVar9->field_0x30;
    ChVector<double>::GetNormalized(&dir,(ChVector<double> *)&V);
    V.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&dir;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&dircolumn,
               (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&V);
    auVar16._0_8_ = (this->area * this->E) / this->length;
    auVar16._8_8_ = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = Kfactor;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = auVar16._0_8_ * this->rdamping * Rfactor;
    auVar1 = vfmadd231sd_fma(auVar17,auVar16,auVar1);
    commonfactor = auVar1._0_8_;
    keV.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&dircolumn;
    keV.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&dircolumn;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&V,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&keV);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                      *)&kgV,&commonfactor,(StorageBaseType *)&V);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&keV,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)&kgV);
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&kgV,H,0,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *)&kgV,(Matrix<double,_3,_3,_1,_3,_3> *)&keV);
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&kgV,H,3,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *)&kgV,(Matrix<double,_3,_3,_1,_3,_3> *)&keV);
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&keV;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&kgV,H,0,3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *)&kgV,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                        *)&local_1e8);
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&keV;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&kgV,H,3,0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                *)&kgV,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                        *)&local_1e8);
    (**(code **)(*(long *)&((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1e8);
    (**(code **)(*(long *)&((((this->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_148);
    auVar11._8_8_ =
         local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar11._0_8_ =
         local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar12._8_8_ = local_148.m_lhs._0_8_;
    auVar12._0_8_ = local_148._0_8_;
    kgV.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         vsubpd_avx(auVar11,auVar12);
    kgV.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] -
         local_148.m_lhs.m_functor.m_other;
    dVar14 = ChVector<double>::Length((ChVector<double> *)&kgV);
    psVar8 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar9 = (psVar8->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar8[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    kgV.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])((long)&peVar10->super_ChNodeFEAbase + 0x20),
                    *(undefined1 (*) [16])((long)&peVar9->super_ChNodeFEAbase + 0x20));
    kgV.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         *(double *)&peVar10->field_0x30 - *(double *)&peVar9->field_0x30;
    dVar15 = ChVector<double>::Length((ChVector<double> *)&kgV);
    local_1f8 = (((dVar15 - dVar14) * ((this->area * this->E) / this->length)) / dVar14) * Kfactor;
    ChMatrix33<double>::ChMatrix33(&local_1e8,1.0);
    local_b8 = &V;
    local_c0 = &local_1e8;
    Eigen::operator*(&local_148,&local_1f8,(StorageBaseType *)&local_c0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&kgV,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)&local_148);
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&local_1e8,H,0,0,3,3);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                  *)&local_1e8,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&kgV);
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&local_1e8,H,3,3,3,3);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                  *)&local_1e8,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&kgV);
    local_148._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&kgV;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&local_1e8,H,0,3,3,3);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                  *)&local_1e8,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)&local_148);
    local_148._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&kgV;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
             *)&local_1e8,H,3,0,3,3);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                  *)&local_1e8,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)&local_148);
    dVar14 = this->mass;
    pSVar13 = Eigen::
              DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)H,0,0);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = Mfactor * dVar14;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar13;
    auVar1 = vfmadd213sd_fma(auVar18,ZEXT816(0x3fe0000000000000),auVar2);
    *pSVar13 = auVar1._0_8_;
    dVar14 = this->mass;
    pSVar13 = Eigen::
              DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)H,1,1);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = Mfactor * dVar14;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pSVar13;
    auVar1 = vfmadd213sd_fma(auVar19,ZEXT816(0x3fe0000000000000),auVar3);
    *pSVar13 = auVar1._0_8_;
    dVar14 = this->mass;
    pSVar13 = Eigen::
              DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)H,2,2);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = Mfactor * dVar14;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pSVar13;
    auVar1 = vfmadd213sd_fma(auVar20,ZEXT816(0x3fe0000000000000),auVar4);
    *pSVar13 = auVar1._0_8_;
    dVar14 = this->mass;
    pSVar13 = Eigen::
              DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)H,3,3);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = Mfactor * dVar14;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pSVar13;
    auVar1 = vfmadd213sd_fma(auVar21,ZEXT816(0x3fe0000000000000),auVar5);
    *pSVar13 = auVar1._0_8_;
    dVar14 = this->mass;
    pSVar13 = Eigen::
              DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)H,4,4);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = Mfactor * dVar14;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *pSVar13;
    auVar1 = vfmadd213sd_fma(auVar22,ZEXT816(0x3fe0000000000000),auVar6);
    *pSVar13 = auVar1._0_8_;
    dVar14 = this->mass;
    pSVar13 = Eigen::
              DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
              ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                            *)H,5,5);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = Mfactor * dVar14;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *pSVar13;
    auVar1 = vfmadd213sd_fma(auVar23,ZEXT816(0x3fe0000000000000),auVar7);
    *pSVar13 = auVar1._0_8_;
    return;
  }
  __assert_fail("(H.rows() == 6) && (H.cols() == 6)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBar.cpp"
                ,0x2a,
                "virtual void chrono::fea::ChElementBar::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementBar::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 6) && (H.cols() == 6));

    // For K stiffness matrix and R damping matrix:
    // compute stiffness matrix (this is already the explicit
    // formulation of the corotational stiffness matrix in 3D)

    ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
    ChVectorN<double, 3> dircolumn = dir.eigen();

    double Kstiffness = ((this->area * this->E) / this->length);
    double Rdamping = this->rdamping * Kstiffness;
    // note that stiffness and damping matrices are the same, so join stuff here
    double commonfactor = Kstiffness * Kfactor + Rdamping * Rfactor;
	ChMatrix33<> V = dircolumn * dircolumn.transpose();
    ChMatrix33<> keV = commonfactor * V;

    H.block(0,0,3,3) = keV;
    H.block(3,3,3,3) = keV;
    H.block(0,3,3,3) = -keV;
    H.block(3,0,3,3) = -keV;

	// add geometric stiffness - in future it might become an option to switch off if not needed.
	// See for ex. http://shodhbhagirathi.iitr.ac.in:8081/jspui/handle/123456789/8433 pag. 14-15
	if (true) {
		double L_ref = (nodes[1]->GetX0() - nodes[0]->GetX0()).Length();
		double L = (nodes[1]->GetPos() - nodes[0]->GetPos()).Length();
		double Kstiffness1 = ((this->area * this->E) / this->length);
		double internal_Kforce_local = Kstiffness1 * (L - L_ref);

		ChMatrix33<> kgV = Kfactor * (internal_Kforce_local / L_ref) * (ChMatrix33<>(1) - V);
		H.block(0, 0, 3, 3) += kgV;
		H.block(3, 3, 3, 3) += kgV;
		H.block(0, 3, 3, 3) += -kgV;
		H.block(3, 0, 3, 3) += -kgV;
	}

    // For M mass matrix, do mass lumping:
    H(0, 0) += Mfactor * mass * 0.5;  // node A x,y,z
    H(1, 1) += Mfactor * mass * 0.5;
    H(2, 2) += Mfactor * mass * 0.5;
    H(3, 3) += Mfactor * mass * 0.5;  // node B x,y,z
    H(4, 4) += Mfactor * mass * 0.5;
    H(5, 5) += Mfactor * mass * 0.5;
}